

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall
miniros::MasterLink::setParamImpl<bool>
          (MasterLink *this,string *key,vector<bool,_std::allocator<bool>_> *vec)

{
  undefined1 uVar1;
  XmlRpcValue *pXVar2;
  size_t i;
  RpcValue xml_vec;
  RpcValue *in_stack_000000a0;
  string *in_stack_000000a8;
  MasterLink *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  XmlRpcValue *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffb8;
  XmlRpcValue *pXVar3;
  XmlRpcValue *this_00;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  XmlRpcValue local_28 [2];
  
  XmlRpc::XmlRpcValue::XmlRpcValue(local_28);
  std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffd0);
  XmlRpc::XmlRpcValue::setSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  pXVar3 = (XmlRpcValue *)0x0;
  while( true ) {
    this_00 = pXVar3;
    pXVar2 = (XmlRpcValue *)
             std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffd0);
    if (pXVar2 <= pXVar3) break;
    uVar1 = std::vector<bool,_std::allocator<bool>_>::at
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff90,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff90 =
         XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    XmlRpc::XmlRpcValue::operator=(this_00,(bool *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
    pXVar3 = (XmlRpcValue *)((long)&this_00->_type + 1);
  }
  set(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x46002f);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}